

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O3

void __thiscall sf2cute::SFPreset::set_global_zone(SFPreset *this,SFPresetZone *global_zone)

{
  SFPresetZone *pSVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer puVar5;
  pointer puVar6;
  SFPreset *pSVar7;
  SFPresetZone *pSVar8;
  invalid_argument *this_00;
  
  if (global_zone->parent_preset_ == (SFPreset *)0x0) {
    SFPresetZone::set_parent_preset(global_zone,this);
    pSVar8 = (SFPresetZone *)operator_new(0x50);
    puVar5 = (global_zone->super_SFZone).generators_.
             super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     &(pSVar8->super_SFZone).generators_.
      super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
      ._M_impl = (global_zone->super_SFZone).generators_.
                 super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)((long)&(pSVar8->super_SFZone).generators_ + 8) = puVar5;
    *(pointer *)((long)&(pSVar8->super_SFZone).generators_ + 0x10) =
         (global_zone->super_SFZone).generators_.
         super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (global_zone->super_SFZone).generators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (global_zone->super_SFZone).generators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (global_zone->super_SFZone).generators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar6 = (global_zone->super_SFZone).modulators_.
             super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     &(pSVar8->super_SFZone).modulators_.
      super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
      ._M_impl = (global_zone->super_SFZone).modulators_.
                 super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)((long)&(pSVar8->super_SFZone).modulators_ + 8) = puVar6;
    *(pointer *)((long)&(pSVar8->super_SFZone).modulators_ + 0x10) =
         (global_zone->super_SFZone).modulators_.
         super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (global_zone->super_SFZone).modulators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (global_zone->super_SFZone).modulators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (global_zone->super_SFZone).modulators_.
    super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar8->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFPresetZone_0011e830;
    uVar2 = *(undefined4 *)
             ((long)&(global_zone->instrument_).
                     super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4)
    ;
    uVar3 = *(undefined4 *)
             &(global_zone->instrument_).
              super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    uVar4 = *(undefined4 *)
             ((long)&(global_zone->instrument_).
                     super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 4);
    *(undefined4 *)
     &(pSVar8->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(undefined4 *)
                &(global_zone->instrument_).
                 super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(undefined4 *)
     ((long)&(pSVar8->instrument_).
             super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2> + 4) = uVar2;
    *(undefined4 *)
     &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(pSVar8->instrument_).
              super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         uVar3;
    *(undefined4 *)
     ((long)&(pSVar8->instrument_).
             super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2> + 0xc) = uVar4;
    (global_zone->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (global_zone->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar8->parent_preset_ = global_zone->parent_preset_;
    pSVar1 = (this->global_zone_)._M_t.
             super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
             .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
    (this->global_zone_)._M_t.
    super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
    super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl = pSVar8;
    if (pSVar1 != (SFPresetZone *)0x0) {
      (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
      return;
    }
  }
  else {
    pSVar7 = SFPresetZone::parent_preset(global_zone);
    if (pSVar7 != this) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"Preset zone has already been owned by another preset.");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return;
}

Assistant:

void SFPreset::set_global_zone(SFPresetZone global_zone) {
  // Check the parent preset of the zone.
  if (global_zone.has_parent_preset()) {
    if (&global_zone.parent_preset() == this) {
      // If the zone is already be owned by this preset, do nothing.
      return;
    }
    else {
      // Otherwise raise an error. A zone cannot be shared by two parents.
      throw std::invalid_argument("Preset zone has already been owned by another preset.");
    }
  }

  // Set this preset to the parent preset of the zone.
  global_zone.set_parent_preset(*this);

  // Set the global zone to this preset.
  global_zone_ = std::make_unique<SFPresetZone>(std::move(global_zone));
}